

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float128 floatx80_to_float128_mips64(floatx80 a,float_status *status)

{
  commonNaNT a_00;
  _Bool _Var1;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  commonNaNT local_68;
  uint64_t local_50;
  uint64_t zSig1;
  uint64_t zSig0;
  uint64_t aSig;
  int aExp;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  status_local = (float_status *)a.low;
  a_local.low._0_2_ = a.high;
  a_01._10_6_ = 0;
  a_01.low = (long)a._0_10_;
  a_01.high = (short)(a._0_10_ >> 0x40);
  _aExp = status;
  _Var1 = floatx80_invalid_encoding(a_01);
  if (_Var1) {
    float_raise_mips64('\x01',_aExp);
    join_0x00000010_0x00000000_ = float128_default_nan_mips64(_aExp);
  }
  else {
    a_02.high = (uint16_t)a_local.low;
    a_02.low = (uint64_t)status_local;
    a_02._10_6_ = 0;
    zSig0 = extractFloatx80Frac(a_02);
    a_03.high = (uint16_t)a_local.low;
    a_03.low = (uint64_t)status_local;
    a_03._10_6_ = 0;
    aSig._0_4_ = extractFloatx80Exp(a_03);
    a_04.high = (uint16_t)a_local.low;
    a_04.low = (uint64_t)status_local;
    a_04._10_6_ = 0;
    aSig._7_1_ = extractFloatx80Sign(a_04);
    if (((int32_t)aSig == 0x7fff) && ((zSig0 & 0x7fffffffffffffff) != 0)) {
      a_05.high = (uint16_t)a_local.low;
      a_05.low = (uint64_t)status_local;
      a_05._10_6_ = 0;
      floatx80ToCommonNaN(&local_68,a_05,_aExp);
      a_00.high = local_68.high;
      a_00.sign = local_68.sign;
      a_00._1_7_ = local_68._1_7_;
      a_00.low = local_68.low;
      join_0x00000010_0x00000000_ = commonNaNToFloat128(a_00,_aExp);
    }
    else {
      shift128Right(zSig0 << 1,0,0x10,&zSig1,&local_50);
      join_0x00000010_0x00000000_ = packFloat128(aSig._7_1_,(int32_t)aSig,zSig1,local_50);
    }
  }
  return stack0xffffffffffffffe8;
}

Assistant:

float128 floatx80_to_float128(floatx80 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint64_t aSig, zSig0, zSig1;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return float128_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( ( aExp == 0x7FFF ) && (uint64_t) ( aSig<<1 ) ) {
        return commonNaNToFloat128(floatx80ToCommonNaN(a, status), status);
    }
    shift128Right( aSig<<1, 0, 16, &zSig0, &zSig1 );
    return packFloat128( aSign, aExp, zSig0, zSig1 );

}